

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dauMerge.c
# Opt level: O0

void Dau_DsdRemoveBraces(char *pDsd,int *pMatches)

{
  char *local_28;
  char *p;
  char *q;
  int *pMatches_local;
  char *pDsd_local;
  
  if (pDsd[1] != '\0') {
    pMatches_local = (int *)pDsd;
    Dau_DsdRemoveBraces_rec(pDsd,(char **)&pMatches_local,pMatches);
    p = pDsd;
    for (local_28 = pDsd; *local_28 != '\0'; local_28 = local_28 + 1) {
      if (*local_28 != ' ') {
        if (((*local_28 == '!') && (p[-1] == '!')) && (local_28 != p)) {
          p = p + -1;
        }
        else {
          *p = *local_28;
          p = p + 1;
        }
      }
    }
    *p = '\0';
  }
  return;
}

Assistant:

void Dau_DsdRemoveBraces( char * pDsd, int * pMatches )
{
    char * q, * p = pDsd;
    if ( pDsd[1] == 0 )
        return;
    Dau_DsdRemoveBraces_rec( pDsd, &pDsd, pMatches );
    for ( q = p; *p; p++ )
        if ( *p != ' ' )
        {
            if ( *p == '!' && *(q-1) == '!' && p != q )
            {
                q--;
                continue;
            }
            *q++ = *p;
        }
    *q = 0;
}